

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O3

Aig_Man_t * Saig_ManDecPropertyOutput(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  char *__s;
  void *pvVar1;
  void **__ptr;
  uint uVar2;
  Vec_Ptr_t *__ptr_00;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  void *pvVar8;
  Aig_Obj_t *p1;
  int iVar9;
  long lVar10;
  
  __ptr_00 = Saig_ManFindPrimes(pAig,nLits,fVerbose);
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  p->nConstrs = pAig->nConstrs;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar6 = pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar10];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar10 = lVar10 + 1;
      pVVar6 = pAig->vCis;
    } while (lVar10 < pVVar6->nSize);
  }
  pVVar6 = pAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar10];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006646df;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        pVVar6 = pAig->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
  }
  if (0 < pAig->nTruePos) {
    lVar10 = 0;
    do {
      if (pAig->vCos->nSize <= lVar10) goto LAB_006646c0;
      pvVar1 = pAig->vCos->pArray[lVar10];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_006646df;
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      uVar7 = uVar5 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar4);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pAig->nTruePos);
  }
  if ((__ptr_00 != (Vec_Ptr_t *)0x0) && (iVar9 = __ptr_00->nSize, 0 < (long)iVar9)) {
    uVar5 = 0;
    do {
      pvVar1 = __ptr_00->pArray[uVar5];
      pAVar4 = p->pConst1;
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar10 = 0;
        do {
          uVar2 = *(uint *)(*(long *)((long)pvVar1 + 8) + lVar10 * 4);
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          pVVar6 = pAig->vObjs;
          if (pVVar6 == (Vec_Ptr_t *)0x0) {
            pvVar8 = (void *)0x0;
          }
          else {
            if (pVVar6->nSize <= (int)(uVar2 >> 1)) goto LAB_006646c0;
            pvVar8 = pVVar6->pArray[uVar2 >> 1];
          }
          if (((ulong)pvVar8 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x13e,"Aig_Obj_t *Aig_ObjCopy(Aig_Obj_t *)");
          }
          pAVar4 = Aig_And(p,pAVar4,(Aig_Obj_t *)
                                    ((ulong)(uVar2 & 1) ^ *(ulong *)((long)pvVar8 + 0x28)));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar1 + 4));
      }
      Aig_ObjCreateCo(p,pAVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(long)iVar9);
  }
  if (0 < pAig->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar9;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_006646c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_006646df:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      uVar7 = uVar5 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar4);
      iVar9 = iVar9 + 1;
    } while (iVar9 < pAig->nRegs);
  }
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,pAig->nRegs);
  if (__ptr_00 == (Vec_Ptr_t *)0x0) {
    return p;
  }
  iVar9 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar9 < 1) {
    if (__ptr == (void **)0x0) goto LAB_00664668;
  }
  else {
    lVar10 = 0;
    do {
      pvVar1 = __ptr[lVar10];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
        }
        free(pvVar1);
      }
      lVar10 = lVar10 + 1;
    } while (iVar9 != lVar10);
  }
  free(__ptr);
LAB_00664668:
  free(__ptr_00);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDecPropertyOutput( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Aig_Man_t * pAigNew = NULL;
    Aig_Obj_t * pObj, * pMiter;
    Vec_Ptr_t * vPrimes;
    Vec_Int_t * vCube;
    int i, k, Lit;

    // compute primes of the comb output function
    vPrimes = Saig_ManFindPrimes( pAig, nLits, fVerbose );

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create original POs of the circuit
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // create prime POs of the circuit
    if ( vPrimes )
    Vec_PtrForEachEntry( Vec_Int_t *, vPrimes, vCube, k )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vCube, Lit, i )
        {
            pObj = Aig_NotCond( Aig_ObjCopy(Aig_ManObj(pAig, Abc_Lit2Var(Lit))), Abc_LitIsCompl(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, pObj );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );

    Vec_VecFreeP( (Vec_Vec_t **)&vPrimes );
    return pAigNew;
}